

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

SC_Lib * Abc_SclReadFromStr(Vec_Str_t *vOut)

{
  Vec_Wrd_t *pVVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  word *pwVar4;
  int iVar5;
  int iVar6;
  int Entry;
  SC_TSense SVar7;
  SC_Lib *pSVar8;
  char *pcVar9;
  undefined8 *puVar10;
  SC_Cell *Entry_00;
  SC_Pin *pSVar11;
  Vec_Ptr_t *p;
  void **ppvVar12;
  Vec_Wrd_t *__ptr;
  word wVar13;
  word wVar14;
  SC_Timings *Entry_01;
  SC_Timing *Entry_02;
  int *pPos;
  Vec_Str_t *pVVar15;
  bool bVar16;
  float fVar17;
  int Pos;
  Vec_Ptr_t *local_58;
  SC_Lib *local_50;
  int local_48;
  int local_44;
  Vec_Ptr_t *local_40;
  char **local_38;
  
  pPos = &Pos;
  Pos = 0;
  pSVar8 = Abc_SclLibAlloc();
  pVVar15 = vOut;
  iVar5 = Vec_StrGetI(vOut,pPos);
  if (iVar5 == 8) {
    pcVar9 = Vec_StrGetS(vOut,&Pos);
    pSVar8->pName = pcVar9;
    pcVar9 = Vec_StrGetS(vOut,&Pos);
    pSVar8->default_wire_load = pcVar9;
    pcVar9 = Vec_StrGetS(vOut,&Pos);
    pSVar8->default_wire_load_sel = pcVar9;
    fVar17 = Vec_StrGetF(vOut,&Pos);
    pSVar8->default_max_out_slew = fVar17;
    iVar5 = Vec_StrGetI(vOut,&Pos);
    pSVar8->unit_time = iVar5;
    fVar17 = Vec_StrGetF(vOut,&Pos);
    pSVar8->unit_cap_fst = fVar17;
    iVar5 = Vec_StrGetI(vOut,&Pos);
    pSVar8->unit_cap_snd = iVar5;
    iVar5 = Vec_StrGetI(vOut,&Pos);
    local_50 = pSVar8;
    while (bVar16 = iVar5 != 0, iVar5 = iVar5 + -1, bVar16) {
      puVar10 = (undefined8 *)calloc(1,0x30);
      Vec_PtrPush(&pSVar8->vWireLoads,puVar10);
      pcVar9 = Vec_StrGetS(vOut,&Pos);
      *puVar10 = pcVar9;
      fVar17 = Vec_StrGetF(vOut,&Pos);
      *(float *)(puVar10 + 1) = fVar17;
      fVar17 = Vec_StrGetF(vOut,&Pos);
      *(float *)((long)puVar10 + 0xc) = fVar17;
      iVar6 = Vec_StrGetI(vOut,&Pos);
      while (bVar16 = iVar6 != 0, iVar6 = iVar6 + -1, bVar16) {
        Entry = Vec_StrGetI(vOut,&Pos);
        Vec_IntPush((Vec_Int_t *)(puVar10 + 2),Entry);
        fVar17 = Vec_StrGetF(vOut,&Pos);
        Vec_FltPush((Vec_Flt_t *)(puVar10 + 4),fVar17);
      }
    }
    iVar5 = Vec_StrGetI(vOut,&Pos);
    local_58 = &local_50->vWireLoadSels;
    while (bVar16 = iVar5 != 0, iVar5 = iVar5 + -1, bVar16) {
      puVar10 = (undefined8 *)calloc(1,0x38);
      Vec_PtrPush(local_58,puVar10);
      pcVar9 = Vec_StrGetS(vOut,&Pos);
      *puVar10 = pcVar9;
      iVar6 = Vec_StrGetI(vOut,&Pos);
      while (bVar16 = iVar6 != 0, iVar6 = iVar6 + -1, bVar16) {
        fVar17 = Vec_StrGetF(vOut,&Pos);
        Vec_FltPush((Vec_Flt_t *)(puVar10 + 1),fVar17);
        fVar17 = Vec_StrGetF(vOut,&Pos);
        Vec_FltPush((Vec_Flt_t *)(puVar10 + 3),fVar17);
        pcVar9 = Vec_StrGetS(vOut,&Pos);
        Vec_PtrPush((Vec_Ptr_t *)(puVar10 + 5),pcVar9);
      }
    }
    iVar5 = Vec_StrGetI(vOut,&Pos);
    local_40 = &local_50->vCells;
    while (pSVar8 = local_50, iVar5 != 0) {
      local_48 = iVar5 + -1;
      Entry_00 = Abc_SclCellAlloc();
      Entry_00->Id = (local_50->vCells).nSize;
      Vec_PtrPush(local_40,Entry_00);
      pcVar9 = Vec_StrGetS(vOut,&Pos);
      Entry_00->pName = pcVar9;
      fVar17 = Vec_StrGetF(vOut,&Pos);
      Entry_00->area = fVar17;
      fVar17 = Vec_StrGetF(vOut,&Pos);
      Entry_00->leakage = fVar17;
      iVar5 = Vec_StrGetI(vOut,&Pos);
      Entry_00->drive_strength = iVar5;
      iVar5 = Vec_StrGetI(vOut,&Pos);
      Entry_00->n_inputs = iVar5;
      iVar5 = Vec_StrGetI(vOut,&Pos);
      Entry_00->n_outputs = iVar5;
      uVar2 = Entry_00->area;
      uVar3 = Entry_00->leakage;
      Entry_00->areaI = (int)((float)uVar2 * 1000.0);
      Entry_00->leakageI = (int)((float)uVar3 * 1000.0);
      local_58 = &Entry_00->vPins;
      for (iVar5 = 0; iVar5 < Entry_00->n_inputs; iVar5 = iVar5 + 1) {
        pSVar11 = Abc_SclPinAlloc();
        Vec_PtrPush(local_58,pSVar11);
        pSVar11->dir = sc_dir_Input;
        pcVar9 = Vec_StrGetS(vOut,&Pos);
        pSVar11->pName = pcVar9;
        fVar17 = Vec_StrGetF(vOut,&Pos);
        pSVar11->rise_cap = fVar17;
        fVar17 = Vec_StrGetF(vOut,&Pos);
        pSVar11->fall_cap = fVar17;
        pSVar11->rise_capI = (int)(pSVar11->rise_cap * 1000.0);
        pSVar11->fall_capI = (int)(fVar17 * 1000.0);
      }
      iVar6 = 0;
      while (iVar5 = local_48, iVar6 < Entry_00->n_outputs) {
        pSVar11 = Abc_SclPinAlloc();
        Vec_PtrPush(local_58,pSVar11);
        pSVar11->dir = sc_dir_Output;
        pcVar9 = Vec_StrGetS(vOut,&Pos);
        pSVar11->pName = pcVar9;
        fVar17 = Vec_StrGetF(vOut,&Pos);
        pSVar11->max_out_cap = fVar17;
        fVar17 = Vec_StrGetF(vOut,&Pos);
        pSVar11->max_out_slew = fVar17;
        iVar5 = Vec_StrGetI(vOut,&Pos);
        if (iVar5 != Entry_00->n_inputs) {
          __assert_fail("k == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x14f,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        if (pSVar11->func_text != (char *)0x0) {
          __assert_fail("pPin->func_text == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x154,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        pcVar9 = Vec_StrGetS(vOut,&Pos);
        pSVar11->func_text = pcVar9;
        local_44 = iVar6;
        if (*pcVar9 == '\0') {
          free(pcVar9);
          pSVar11->func_text = (char *)0x0;
          if ((pSVar11->vFunc).nSize != 0) {
            __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x15a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          pVVar1 = &pSVar11->vFunc;
          iVar5 = 1 << ((char)Entry_00->n_inputs - 6U & 0x1f);
          if (Entry_00->n_inputs < 7) {
            iVar5 = 1;
          }
          Vec_WrdGrow(pVVar1,iVar5);
          for (iVar5 = 0; iVar5 < pVVar1->nCap; iVar5 = iVar5 + 1) {
            wVar13 = Vec_StrGetW(vOut,&Pos);
            Vec_WrdPush(pVVar1,wVar13);
          }
        }
        else {
          iVar5 = Entry_00->n_inputs;
          p = (Vec_Ptr_t *)malloc(0x10);
          iVar6 = iVar5;
          if (iVar5 - 1U < 7) {
            iVar6 = 8;
          }
          p->nSize = 0;
          p->nCap = iVar6;
          if (iVar6 == 0) {
            ppvVar12 = (void **)0x0;
          }
          else {
            ppvVar12 = (void **)malloc((long)iVar6 << 3);
          }
          p->pArray = ppvVar12;
          for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
            puVar10 = (undefined8 *)Vec_PtrEntry(local_58,iVar6);
            Vec_PtrPush(p,(void *)*puVar10);
            iVar5 = Entry_00->n_inputs;
          }
          if ((pSVar11->vFunc).nSize != 0) {
            __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x16a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          pwVar4 = (pSVar11->vFunc).pArray;
          if (pwVar4 != (word *)0x0) {
            free(pwVar4);
            (pSVar11->vFunc).pArray = (word *)0x0;
            iVar5 = Entry_00->n_inputs;
          }
          (pSVar11->vFunc).nCap = 0;
          (pSVar11->vFunc).nSize = 0;
          pVVar1 = &pSVar11->vFunc;
          local_38 = (char **)p->pArray;
          __ptr = Mio_ParseFormulaTruth(pSVar11->func_text,local_38,iVar5);
          iVar5 = __ptr->nSize;
          pwVar4 = __ptr->pArray;
          pVVar1->nCap = __ptr->nCap;
          pVVar1->nSize = iVar5;
          (pSVar11->vFunc).pArray = pwVar4;
          free(__ptr);
          free(local_38);
          free(p);
          iVar5 = 1 << ((char)Entry_00->n_inputs - 6U & 0x1f);
          if (Entry_00->n_inputs < 7) {
            iVar5 = 1;
          }
          if ((pSVar11->vFunc).nSize != iVar5) {
            __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x171,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          iVar5 = 0;
          while (iVar5 < (pSVar11->vFunc).nSize) {
            wVar13 = Vec_StrGetW(vOut,&Pos);
            wVar14 = Vec_WrdEntry(pVVar1,iVar5);
            iVar5 = iVar5 + 1;
            if (wVar13 != wVar14) {
              __assert_fail("Value == Vec_WrdEntry(&pPin->vFunc, k)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                            ,0x175,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
            }
          }
        }
        for (iVar5 = 0; iVar5 < Entry_00->n_inputs; iVar5 = iVar5 + 1) {
          Entry_01 = Abc_SclTimingsAlloc();
          Vec_PtrPush(&pSVar11->vRTimings,Entry_01);
          pcVar9 = Vec_StrGetS(vOut,&Pos);
          Entry_01->pName = pcVar9;
          iVar6 = Vec_StrGetI(vOut,&Pos);
          if (1 < iVar6) {
            __assert_fail("n <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x180,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          if (iVar6 == 1) {
            Entry_02 = Abc_SclTimingAlloc();
            Vec_PtrPush(&Entry_01->vTimings,Entry_02);
            SVar7 = Vec_StrGetI(vOut,&Pos);
            Entry_02->tsense = SVar7;
            Abc_SclReadSurface(vOut,&Pos,&Entry_02->pCellRise);
            Abc_SclReadSurface(vOut,&Pos,&Entry_02->pCellFall);
            Abc_SclReadSurface(vOut,&Pos,&Entry_02->pRiseTrans);
            Abc_SclReadSurface(vOut,&Pos,&Entry_02->pFallTrans);
          }
          else if ((Entry_01->vTimings).nSize != 0) {
            __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x18d,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
        }
        iVar6 = local_44 + 1;
      }
    }
    if (Pos != vOut->nSize) {
      __assert_fail("Pos == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                    ,0x19b,"SC_Lib *Abc_SclReadFromStr(Vec_Str_t *)");
    }
    Abc_SclHashCells(local_50);
    Abc_SclLinkCells(pSVar8);
  }
  else {
    pSVar8 = (SC_Lib *)0x0;
    Abc_Print((int)pVVar15,(char *)pPos);
  }
  return pSVar8;
}

Assistant:

SC_Lib * Abc_SclReadFromStr( Vec_Str_t * vOut )
{
    SC_Lib * p;
    int Pos = 0;
    // read the library
    p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibrary( vOut, &Pos, p ) )
        return NULL;
    assert( Pos == Vec_StrSize(vOut) );
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}